

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

void __thiscall
CDefineTableEntry::CDefineTableEntry
          (CDefineTableEntry *this,char *nname,char *nvalue,CStringsList *nnss,
          CDefineTableEntry *nnext)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  
  this->name = (char *)0x0;
  this->value = (char *)0x0;
  pcVar2 = strdup(nname);
  this->name = pcVar2;
  sVar3 = strlen(nvalue);
  pcVar4 = (char *)operator_new__(sVar3 + 1);
  this->value = pcVar4;
  if (pcVar2 == (char *)0x0) {
    ErrorOOM();
  }
  pcVar2 = this->value;
  lVar5 = 0;
  while( true ) {
    bVar1 = nvalue[lVar5];
    if ((bVar1 < 0xe) && ((0x2401U >> (bVar1 & 0x1f) & 1) != 0)) break;
    pcVar2[lVar5] = bVar1;
    lVar5 = lVar5 + 1;
  }
  pcVar2[lVar5] = '\0';
  this->next = nnext;
  this->nss = nnss;
  return;
}

Assistant:

CDefineTableEntry::CDefineTableEntry(const char* nname, const char* nvalue, CStringsList* nnss, CDefineTableEntry* nnext)
		: name(NULL), value(NULL) {
	name = STRDUP(nname);
	value = new char[strlen(nvalue) + 1];
	if (NULL == name || NULL == value) ErrorOOM();
	char* s1 = value;
	while (*nvalue && *nvalue != '\n' && *nvalue != '\r') *s1++ = *nvalue++;
	*s1 = 0;
	next = nnext;
	nss = nnss;
}